

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O1

int llhttp__internal__c_mul_add_status_code
              (llhttp__internal_t *state,uchar *p,uchar *endp,int match)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 1;
  if (state->status_code < 0x199a) {
    uVar1 = state->status_code * 10;
    state->status_code = uVar1;
    uVar3 = (uint)uVar1;
    if (match < 0) {
      if (SBORROW4(uVar3,-match) != (int)(uVar3 + match) < 0) {
        return 1;
      }
    }
    else if (0xffff - match < (int)uVar3) {
      return 1;
    }
    state->status_code = uVar1 + (short)match;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int llhttp__internal__c_mul_add_status_code(
    llhttp__internal_t* state,
    const unsigned char* p,
    const unsigned char* endp,
    int match) {
  /* Multiplication overflow */
  if (state->status_code > 0xffff / 10) {
    return 1;
  }
  
  state->status_code *= 10;
  
  /* Addition overflow */
  if (match >= 0) {
    if (state->status_code > 0xffff - match) {
      return 1;
    }
  } else {
    if (state->status_code < 0 - match) {
      return 1;
    }
  }
  state->status_code += match;
  return 0;
}